

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::addSamplerString(CLIntercept *this,cl_sampler sampler,string *str)

{
  mutex *__mutex;
  int iVar1;
  mapped_type *pmVar2;
  undefined8 uVar3;
  cl_sampler local_20;
  
  if (sampler != (cl_sampler)0x0) {
    __mutex = &this->m_Mutex;
    local_20 = sampler;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      uVar3 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar3);
    }
    pmVar2 = std::
             map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->m_SamplerDataMap,&local_20);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::addSamplerString(
    cl_sampler sampler,
    const std::string& str )
{
    if( sampler )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_SamplerDataMap[sampler] = str;
    }
}